

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

bool __thiscall flatbuffers::go::GoGenerator::generate(GoGenerator *this)

{
  bool bVar1;
  char *name;
  Namespace *ns;
  undefined1 local_b0 [8];
  string filename;
  allocator<char> local_69;
  undefined1 local_68 [6];
  bool is_enum;
  string code;
  undefined1 local_38 [8];
  string one_file_code;
  GoGenerator *this_local;
  
  one_file_code.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  bVar1 = generateEnums(this,(string *)local_38);
  if (bVar1) {
    bVar1 = generateStructs(this,(string *)local_38);
    if (bVar1) {
      if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
        this_local._7_1_ = true;
        code.field_2._8_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"",&local_69);
        std::allocator<char>::~allocator(&local_69);
        bVar1 = std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::empty
                          (&(((this->super_BaseGenerator).parser_)->enums_).vec);
        BaseGenerator::LastNamespacePart_abi_cxx11_
                  ((string *)((long)&filename.field_2 + 8),(BaseGenerator *)&this->go_namespace_,ns)
        ;
        BeginFile(this,(string *)((long)&filename.field_2 + 8),true,!bVar1,(string *)local_68);
        std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_68,(string *)local_38);
        BaseGenerator::GeneratedFileName
                  ((string *)local_b0,&this->super_BaseGenerator,(this->super_BaseGenerator).path_,
                   (this->super_BaseGenerator).file_name_,
                   &((this->super_BaseGenerator).parser_)->opts);
        name = (char *)std::__cxx11::string::c_str();
        this_local._7_1_ = SaveFile(name,(string *)local_68,false);
        code.field_2._8_4_ = 1;
        std::__cxx11::string::~string((string *)local_b0);
        std::__cxx11::string::~string((string *)local_68);
      }
    }
    else {
      this_local._7_1_ = false;
      code.field_2._8_4_ = 1;
    }
  }
  else {
    this_local._7_1_ = false;
    code.field_2._8_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_38);
  return this_local._7_1_;
}

Assistant:

bool generate() {
    std::string one_file_code;

    if (!generateEnums(&one_file_code)) return false;
    if (!generateStructs(&one_file_code)) return false;

    if (parser_.opts.one_file) {
      std::string code = "";
      const bool is_enum = !parser_.enums_.vec.empty();
      BeginFile(LastNamespacePart(go_namespace_), true, is_enum, &code);
      code += one_file_code;
      const std::string filename =
          GeneratedFileName(path_, file_name_, parser_.opts);
      return SaveFile(filename.c_str(), code, false);
    }

    return true;
  }